

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitLoad(PrintExpressionContents *this,Load *curr)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  address64_t aVar6;
  Module *in_R8;
  Name name;
  char *local_70;
  BasicType local_34 [3];
  Type local_28;
  uintptr_t local_20;
  Load *local_18;
  Load *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (Load *)this;
  poVar5 = prepareColor(this->o);
  local_28.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type
                .id;
  aVar6 = wasm::Address::operator_cast_to_unsigned_long(&local_18->align);
  local_20 = (uintptr_t)forceConcrete(local_28,(Index)aVar6);
  wasm::operator<<(poVar5,(Type)local_20);
  if ((local_18->isAtomic & 1U) != 0) {
    std::operator<<(this->o,".atomic");
  }
  std::operator<<(this->o,".load");
  local_34[2] = 1;
  bVar2 = wasm::Type::operator!=
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)12>).
                      super_Expression.type,local_34 + 2);
  bVar3 = false;
  if (bVar2) {
    bVar1 = local_18->bytes;
    uVar4 = wasm::Type::getByteSize
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)12>).
                        super_Expression.type);
    bVar3 = bVar1 < uVar4;
  }
  if (bVar3) {
    if (local_18->bytes == '\x01') {
      std::operator<<(this->o,'8');
    }
    else if (local_18->bytes == '\x02') {
      local_34[1] = 4;
      bVar3 = wasm::Type::operator==
                        (&(local_18->super_SpecificExpression<(wasm::Expression::Id)12>).
                          super_Expression.type,local_34 + 1);
      if (bVar3) {
        std::operator<<(this->o,"_f16");
      }
      else {
        std::operator<<(this->o,"16");
      }
    }
    else {
      if (local_18->bytes != '\x04') {
        abort();
      }
      std::operator<<(this->o,"32");
    }
    local_34[0] = f32;
    bVar3 = wasm::Type::operator!=
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)12>).
                        super_Expression.type,local_34);
    if (bVar3) {
      if ((local_18->signed_ & 1U) == 0) {
        local_70 = "i64.load32_u";
      }
      else {
        local_70 = "i64.load32_s";
      }
      local_70 = local_70 + 10;
      std::operator<<(this->o,local_70);
    }
  }
  restoreNormalColor(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(local_18->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(local_18->memory).super_IString.str._M_len,name,
             (ostream *)this->wasm,in_R8);
  aVar6 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
  if (aVar6 != 0) {
    poVar5 = std::operator<<(this->o," offset=");
    aVar6 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
    std::ostream::operator<<(poVar5,aVar6);
  }
  aVar6 = wasm::Address::operator_cast_to_unsigned_long(&local_18->align);
  if (aVar6 != local_18->bytes) {
    poVar5 = std::operator<<(this->o," align=");
    aVar6 = wasm::Address::operator_cast_to_unsigned_long(&local_18->align);
    std::ostream::operator<<(poVar5,aVar6);
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
    prepareColor(o) << forceConcrete(curr->type, curr->align);
    if (curr->isAtomic) {
      o << ".atomic";
    }
    o << ".load";
    if (curr->type != Type::unreachable &&
        curr->bytes < curr->type.getByteSize()) {
      if (curr->bytes == 1) {
        o << '8';
      } else if (curr->bytes == 2) {
        if (curr->type == Type::f32) {
          o << "_f16";
        } else {
          o << "16";
        }
      } else if (curr->bytes == 4) {
        o << "32";
      } else {
        abort();
      }
      if (curr->type != Type::f32) {
        o << (curr->signed_ ? "_s" : "_u");
      }
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->bytes) {
      o << " align=" << curr->align;
    }
  }